

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adapt.c
# Opt level: O3

REF_STATUS ref_adapt_pass(REF_GRID ref_grid,REF_BOOL *all_done)

{
  uint uVar1;
  REF_ADAPT pRVar2;
  undefined8 uVar3;
  char *pcVar4;
  REF_INT ngeom;
  REF_BOOL all_done1;
  REF_BOOL all_done0;
  int local_2c;
  int local_28;
  int local_24;
  
  uVar1 = ref_adapt_parameter(ref_grid,&local_24);
  if (uVar1 == 0) {
    uVar1 = ref_gather_ngeom(ref_grid->node,ref_grid->geom,2,&local_2c);
    if (uVar1 == 0) {
      if ((local_2c < 1) || (uVar1 = ref_geom_verify_topo(ref_grid), uVar1 == 0)) {
        uVar1 = ref_gather_tec_movie_frame(ref_grid,"threed pass");
        if (uVar1 == 0) {
          pRVar2 = ref_grid->adapt;
          if (1 < pRVar2->timing_level) {
            ref_mpi_stopwatch_stop(ref_grid->mpi,"adapt start");
            pRVar2 = ref_grid->adapt;
          }
          if (pRVar2->watch_param != 0) {
            uVar1 = ref_adapt_tattle(ref_grid,"start");
            if (uVar1 != 0) {
              pcVar4 = "tattle";
              uVar3 = 0x27c;
              goto LAB_00168806;
            }
            pRVar2 = ref_grid->adapt;
          }
          if ((pRVar2->watch_topo == 0) || (uVar1 = ref_adapt_topo(ref_grid), uVar1 == 0)) {
            uVar1 = ref_adapt_swap(ref_grid);
            if (uVar1 == 0) {
              uVar1 = ref_gather_tec_movie_frame(ref_grid,"swap");
              if (uVar1 == 0) {
                pRVar2 = ref_grid->adapt;
                if (1 < pRVar2->timing_level) {
                  ref_mpi_stopwatch_stop(ref_grid->mpi,"adapt swap");
                  pRVar2 = ref_grid->adapt;
                }
                if (pRVar2->watch_param != 0) {
                  uVar1 = ref_adapt_tattle(ref_grid,"swap");
                  if (uVar1 != 0) {
                    pcVar4 = "tattle";
                    uVar3 = 0x285;
                    goto LAB_00168806;
                  }
                  pRVar2 = ref_grid->adapt;
                }
                if ((pRVar2->watch_topo == 0) || (uVar1 = ref_adapt_topo(ref_grid), uVar1 == 0)) {
                  uVar1 = ref_collapse_pass(ref_grid);
                  if (uVar1 == 0) {
                    uVar1 = ref_gather_tec_movie_frame(ref_grid,"collapse");
                    if (uVar1 == 0) {
                      pRVar2 = ref_grid->adapt;
                      if (1 < pRVar2->timing_level) {
                        ref_mpi_stopwatch_stop(ref_grid->mpi,"adapt col");
                        pRVar2 = ref_grid->adapt;
                      }
                      if (pRVar2->watch_param != 0) {
                        uVar1 = ref_adapt_tattle(ref_grid,"col");
                        if (uVar1 != 0) {
                          pcVar4 = "tattle";
                          uVar3 = 0x28e;
                          goto LAB_00168806;
                        }
                        pRVar2 = ref_grid->adapt;
                      }
                      if ((pRVar2->watch_topo == 0) ||
                         (uVar1 = ref_adapt_topo(ref_grid), uVar1 == 0)) {
                        uVar1 = ref_adapt_swap(ref_grid);
                        if (uVar1 == 0) {
                          uVar1 = ref_gather_tec_movie_frame(ref_grid,"swap");
                          if (uVar1 == 0) {
                            pRVar2 = ref_grid->adapt;
                            if (1 < pRVar2->timing_level) {
                              ref_mpi_stopwatch_stop(ref_grid->mpi,"adapt swap");
                              pRVar2 = ref_grid->adapt;
                            }
                            if (pRVar2->watch_param != 0) {
                              uVar1 = ref_adapt_tattle(ref_grid,"swap");
                              if (uVar1 != 0) {
                                pcVar4 = "tattle";
                                uVar3 = 0x297;
                                goto LAB_00168806;
                              }
                              pRVar2 = ref_grid->adapt;
                            }
                            if (pRVar2->watch_topo != 0) {
                              uVar1 = ref_adapt_topo(ref_grid);
                              if (uVar1 != 0) {
                                pcVar4 = "topo";
                                uVar3 = 0x299;
                                goto LAB_00168806;
                              }
                              pRVar2 = ref_grid->adapt;
                            }
                            pRVar2->post_max_ratio = 1.4142135623730951;
                            uVar1 = ref_collapse_pass(ref_grid);
                            if (uVar1 == 0) {
                              uVar1 = ref_gather_tec_movie_frame(ref_grid,"collapse");
                              if (uVar1 == 0) {
                                pRVar2 = ref_grid->adapt;
                                if (1 < pRVar2->timing_level) {
                                  ref_mpi_stopwatch_stop(ref_grid->mpi,"adapt col");
                                  pRVar2 = ref_grid->adapt;
                                }
                                if (pRVar2->watch_param != 0) {
                                  uVar1 = ref_adapt_tattle(ref_grid,"col");
                                  if (uVar1 != 0) {
                                    pcVar4 = "tattle";
                                    uVar3 = 0x2a2;
                                    goto LAB_00168806;
                                  }
                                  pRVar2 = ref_grid->adapt;
                                }
                                if (pRVar2->watch_topo != 0) {
                                  uVar1 = ref_adapt_topo(ref_grid);
                                  if (uVar1 != 0) {
                                    pcVar4 = "topo";
                                    uVar3 = 0x2a4;
                                    goto LAB_00168806;
                                  }
                                  pRVar2 = ref_grid->adapt;
                                }
                                pRVar2->post_max_ratio = pRVar2->last_max_ratio;
                                uVar1 = ref_adapt_swap(ref_grid);
                                if (uVar1 == 0) {
                                  uVar1 = ref_gather_tec_movie_frame(ref_grid,"swap");
                                  if (uVar1 == 0) {
                                    pRVar2 = ref_grid->adapt;
                                    if (1 < pRVar2->timing_level) {
                                      ref_mpi_stopwatch_stop(ref_grid->mpi,"adapt swap");
                                      pRVar2 = ref_grid->adapt;
                                    }
                                    if (pRVar2->watch_param != 0) {
                                      uVar1 = ref_adapt_tattle(ref_grid,"swap");
                                      if (uVar1 != 0) {
                                        pcVar4 = "tattle";
                                        uVar3 = 0x2af;
                                        goto LAB_00168806;
                                      }
                                      pRVar2 = ref_grid->adapt;
                                    }
                                    if ((pRVar2->watch_topo == 0) ||
                                       (uVar1 = ref_adapt_topo(ref_grid), uVar1 == 0)) {
                                      uVar1 = ref_smooth_pass(ref_grid);
                                      if (uVar1 == 0) {
                                        uVar1 = ref_gather_tec_movie_frame(ref_grid,"smooth");
                                        if (uVar1 == 0) {
                                          pRVar2 = ref_grid->adapt;
                                          if (1 < pRVar2->timing_level) {
                                            ref_mpi_stopwatch_stop(ref_grid->mpi,"adapt move");
                                            pRVar2 = ref_grid->adapt;
                                          }
                                          if (pRVar2->watch_param != 0) {
                                            uVar1 = ref_adapt_tattle(ref_grid,"move");
                                            if (uVar1 != 0) {
                                              pcVar4 = "tattle";
                                              uVar3 = 0x2b8;
                                              goto LAB_00168806;
                                            }
                                            pRVar2 = ref_grid->adapt;
                                          }
                                          if ((pRVar2->watch_topo == 0) ||
                                             (uVar1 = ref_adapt_topo(ref_grid), uVar1 == 0)) {
                                            uVar1 = ref_adapt_swap(ref_grid);
                                            if (uVar1 == 0) {
                                              uVar1 = ref_gather_tec_movie_frame(ref_grid,"swap");
                                              if (uVar1 == 0) {
                                                pRVar2 = ref_grid->adapt;
                                                if (1 < pRVar2->timing_level) {
                                                  ref_mpi_stopwatch_stop(ref_grid->mpi,"adapt swap")
                                                  ;
                                                  pRVar2 = ref_grid->adapt;
                                                }
                                                if (pRVar2->watch_param != 0) {
                                                  uVar1 = ref_adapt_tattle(ref_grid,"swap");
                                                  if (uVar1 != 0) {
                                                    pcVar4 = "tattle";
                                                    uVar3 = 0x2c2;
                                                    goto LAB_00168806;
                                                  }
                                                  pRVar2 = ref_grid->adapt;
                                                }
                                                if ((pRVar2->watch_topo == 0) ||
                                                   (uVar1 = ref_adapt_topo(ref_grid), uVar1 == 0)) {
                                                  uVar1 = ref_adapt_parameter(ref_grid,&local_28);
                                                  if (uVar1 == 0) {
                                                    uVar1 = ref_split_pass(ref_grid);
                                                    if (uVar1 == 0) {
                                                      uVar1 = ref_gather_tec_movie_frame
                                                                        (ref_grid,"split");
                                                      if (uVar1 == 0) {
                                                        pRVar2 = ref_grid->adapt;
                                                        if (1 < pRVar2->timing_level) {
                                                          ref_mpi_stopwatch_stop
                                                                    (ref_grid->mpi,"adapt spl");
                                                          pRVar2 = ref_grid->adapt;
                                                        }
                                                        if (pRVar2->watch_param != 0) {
                                                          uVar1 = ref_adapt_tattle(ref_grid,"split")
                                                          ;
                                                          if (uVar1 != 0) {
                                                            pcVar4 = "tattle";
                                                            uVar3 = 0x2cd;
                                                            goto LAB_00168806;
                                                          }
                                                          pRVar2 = ref_grid->adapt;
                                                        }
                                                        if ((pRVar2->watch_topo == 0) ||
                                                           (uVar1 = ref_adapt_topo(ref_grid),
                                                           uVar1 == 0)) {
                                                          uVar1 = ref_adapt_swap(ref_grid);
                                                          if (uVar1 == 0) {
                                                            uVar1 = ref_gather_tec_movie_frame
                                                                              (ref_grid,"swap");
                                                            if (uVar1 == 0) {
                                                              pRVar2 = ref_grid->adapt;
                                                              if (1 < pRVar2->timing_level) {
                                                                ref_mpi_stopwatch_stop
                                                                          (ref_grid->mpi,
                                                                           "adapt swap");
                                                                pRVar2 = ref_grid->adapt;
                                                              }
                                                              if (pRVar2->watch_param != 0) {
                                                                uVar1 = ref_adapt_tattle(ref_grid,
                                                  "swap");
                                                  if (uVar1 != 0) {
                                                    pcVar4 = "tattle";
                                                    uVar3 = 0x2d6;
                                                    goto LAB_00168806;
                                                  }
                                                  pRVar2 = ref_grid->adapt;
                                                  }
                                                  if ((pRVar2->watch_topo == 0) ||
                                                     (uVar1 = ref_adapt_topo(ref_grid), uVar1 == 0))
                                                  {
                                                    uVar1 = ref_smooth_pass(ref_grid);
                                                    if (uVar1 == 0) {
                                                      uVar1 = ref_gather_tec_movie_frame
                                                                        (ref_grid,"smooth");
                                                      if (uVar1 == 0) {
                                                        pRVar2 = ref_grid->adapt;
                                                        if (1 < pRVar2->timing_level) {
                                                          ref_mpi_stopwatch_stop
                                                                    (ref_grid->mpi,"adapt move");
                                                          pRVar2 = ref_grid->adapt;
                                                        }
                                                        if (pRVar2->watch_param != 0) {
                                                          uVar1 = ref_adapt_tattle(ref_grid,"move");
                                                          if (uVar1 != 0) {
                                                            pcVar4 = "tattle";
                                                            uVar3 = 0x2e0;
                                                            goto LAB_00168806;
                                                          }
                                                          pRVar2 = ref_grid->adapt;
                                                        }
                                                        if ((pRVar2->watch_topo == 0) ||
                                                           (uVar1 = ref_adapt_topo(ref_grid),
                                                           uVar1 == 0)) {
                                                          uVar1 = ref_adapt_swap(ref_grid);
                                                          if (uVar1 == 0) {
                                                            uVar1 = ref_gather_tec_movie_frame
                                                                              (ref_grid,"swap");
                                                            if (uVar1 == 0) {
                                                              pRVar2 = ref_grid->adapt;
                                                              if (1 < pRVar2->timing_level) {
                                                                ref_mpi_stopwatch_stop
                                                                          (ref_grid->mpi,
                                                                           "adapt swap");
                                                                pRVar2 = ref_grid->adapt;
                                                              }
                                                              if (pRVar2->watch_param != 0) {
                                                                uVar1 = ref_adapt_tattle(ref_grid,
                                                  "swap");
                                                  if (uVar1 != 0) {
                                                    pcVar4 = "tattle";
                                                    uVar3 = 0x2e9;
                                                    goto LAB_00168806;
                                                  }
                                                  pRVar2 = ref_grid->adapt;
                                                  }
                                                  if (pRVar2->watch_topo != 0) {
                                                    uVar1 = ref_adapt_topo(ref_grid);
                                                    if (uVar1 != 0) {
                                                      pcVar4 = "topo";
                                                      uVar3 = 0x2eb;
                                                      goto LAB_00168806;
                                                    }
                                                    pRVar2 = ref_grid->adapt;
                                                  }
                                                  pRVar2->post_max_ratio = 1.4142135623730951;
                                                  uVar1 = ref_collapse_pass(ref_grid);
                                                  if (uVar1 == 0) {
                                                    uVar1 = ref_gather_tec_movie_frame
                                                                      (ref_grid,"collapse");
                                                    if (uVar1 == 0) {
                                                      pRVar2 = ref_grid->adapt;
                                                      if (1 < pRVar2->timing_level) {
                                                        ref_mpi_stopwatch_stop
                                                                  (ref_grid->mpi,"adapt col");
                                                        pRVar2 = ref_grid->adapt;
                                                      }
                                                      if (pRVar2->watch_param != 0) {
                                                        uVar1 = ref_adapt_tattle(ref_grid,"col");
                                                        if (uVar1 != 0) {
                                                          pcVar4 = "tattle";
                                                          uVar3 = 0x2f5;
                                                          goto LAB_00168806;
                                                        }
                                                        pRVar2 = ref_grid->adapt;
                                                      }
                                                      if (pRVar2->watch_topo != 0) {
                                                        uVar1 = ref_adapt_topo(ref_grid);
                                                        if (uVar1 != 0) {
                                                          pcVar4 = "topo";
                                                          uVar3 = 0x2f7;
                                                          goto LAB_00168806;
                                                        }
                                                        pRVar2 = ref_grid->adapt;
                                                      }
                                                      pRVar2->post_max_ratio =
                                                           pRVar2->last_max_ratio;
                                                      uVar1 = ref_adapt_swap(ref_grid);
                                                      if (uVar1 == 0) {
                                                        uVar1 = ref_gather_tec_movie_frame
                                                                          (ref_grid,"swap");
                                                        if (uVar1 == 0) {
                                                          pRVar2 = ref_grid->adapt;
                                                          if (1 < pRVar2->timing_level) {
                                                            ref_mpi_stopwatch_stop
                                                                      (ref_grid->mpi,"adapt swap");
                                                            pRVar2 = ref_grid->adapt;
                                                          }
                                                          if (pRVar2->watch_param != 0) {
                                                            uVar1 = ref_adapt_tattle(ref_grid,"swap"
                                                                                    );
                                                            if (uVar1 != 0) {
                                                              pcVar4 = "tattle";
                                                              uVar3 = 0x301;
                                                              goto LAB_00168806;
                                                            }
                                                            pRVar2 = ref_grid->adapt;
                                                          }
                                                          if ((pRVar2->watch_topo == 0) ||
                                                             (uVar1 = ref_adapt_topo(ref_grid),
                                                             uVar1 == 0)) {
                                                            uVar1 = ref_smooth_pass(ref_grid);
                                                            if (uVar1 == 0) {
                                                              uVar1 = ref_gather_tec_movie_frame
                                                                                (ref_grid,"smooth");
                                                              if (uVar1 == 0) {
                                                                pRVar2 = ref_grid->adapt;
                                                                if (1 < pRVar2->timing_level) {
                                                                  ref_mpi_stopwatch_stop
                                                                            (ref_grid->mpi,
                                                                             "adapt move");
                                                                  pRVar2 = ref_grid->adapt;
                                                                }
                                                                if (pRVar2->watch_param != 0) {
                                                                  uVar1 = ref_adapt_tattle(ref_grid,
                                                  "move");
                                                  if (uVar1 != 0) {
                                                    pcVar4 = "tattle";
                                                    uVar3 = 0x30b;
                                                    goto LAB_00168806;
                                                  }
                                                  pRVar2 = ref_grid->adapt;
                                                  }
                                                  if ((pRVar2->watch_topo == 0) ||
                                                     (uVar1 = ref_adapt_topo(ref_grid), uVar1 == 0))
                                                  {
                                                    uVar1 = ref_adapt_swap(ref_grid);
                                                    if (uVar1 == 0) {
                                                      uVar1 = ref_gather_tec_movie_frame
                                                                        (ref_grid,"swap");
                                                      if (uVar1 == 0) {
                                                        pRVar2 = ref_grid->adapt;
                                                        if (1 < pRVar2->timing_level) {
                                                          ref_mpi_stopwatch_stop
                                                                    (ref_grid->mpi,"adapt swap");
                                                          pRVar2 = ref_grid->adapt;
                                                        }
                                                        if (pRVar2->watch_param != 0) {
                                                          uVar1 = ref_adapt_tattle(ref_grid,"swap");
                                                          if (uVar1 != 0) {
                                                            pcVar4 = "tattle";
                                                            uVar3 = 0x314;
                                                            goto LAB_00168806;
                                                          }
                                                          pRVar2 = ref_grid->adapt;
                                                        }
                                                        if (pRVar2->watch_topo != 0) {
                                                          uVar1 = ref_adapt_topo(ref_grid);
                                                          if (uVar1 != 0) {
                                                            pcVar4 = "topo";
                                                            uVar3 = 0x316;
                                                            goto LAB_00168806;
                                                          }
                                                          pRVar2 = ref_grid->adapt;
                                                        }
                                                        if (pRVar2->unlock_tet != 0) {
                                                          uVar1 = ref_split_edge_geometry(ref_grid);
                                                          if (uVar1 != 0) {
                                                            pcVar4 = "split edge geom";
                                                            uVar3 = 0x31a;
                                                            goto LAB_00168806;
                                                          }
                                                          if (1 < ref_grid->adapt->timing_level) {
                                                            ref_mpi_stopwatch_stop
                                                                      (ref_grid->mpi,"adapt unlock")
                                                            ;
                                                          }
                                                        }
                                                        uVar1 = ref_adapt_tattle(ref_grid,"adapt");
                                                        if (uVar1 == 0) {
                                                          if ((local_2c < 1) ||
                                                             (uVar1 = ref_geom_verify_topo(ref_grid)
                                                             , uVar1 == 0)) {
                                                            *all_done = (uint)(local_28 != 0 &&
                                                                              local_24 != 0);
                                                            return 0;
                                                          }
                                                          pcVar4 = "geom topo postflight check";
                                                          uVar3 = 0x322;
                                                        }
                                                        else {
                                                          pcVar4 = "tattle";
                                                          uVar3 = 799;
                                                        }
                                                      }
                                                      else {
                                                        pcVar4 = "movie frame";
                                                        uVar3 = 0x310;
                                                      }
                                                    }
                                                    else {
                                                      pcVar4 = "swap pass";
                                                      uVar3 = 0x30f;
                                                    }
                                                  }
                                                  else {
                                                    pcVar4 = "topo";
                                                    uVar3 = 0x30d;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "movie frame";
                                                    uVar3 = 0x307;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "smooth pass";
                                                    uVar3 = 0x306;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "topo";
                                                    uVar3 = 0x303;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "movie frame";
                                                    uVar3 = 0x2fd;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "swap pass";
                                                    uVar3 = 0x2fc;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "movie frame";
                                                    uVar3 = 0x2f1;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "col pass";
                                                    uVar3 = 0x2f0;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "movie frame";
                                                    uVar3 = 0x2e5;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "swap pass";
                                                    uVar3 = 0x2e4;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "topo";
                                                    uVar3 = 0x2e2;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "movie frame";
                                                    uVar3 = 0x2dc;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "smooth pass";
                                                    uVar3 = 0x2db;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "topo";
                                                    uVar3 = 0x2d8;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "movie frame";
                                                    uVar3 = 0x2d2;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "swap pass";
                                                    uVar3 = 0x2d1;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "topo";
                                                    uVar3 = 0x2cf;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "movie frame";
                                                    uVar3 = 0x2c9;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "split surfpass";
                                                    uVar3 = 0x2c8;
                                                  }
                                                  }
                                                  else {
                                                    pcVar4 = "param";
                                                    uVar3 = 0x2c6;
                                                  }
                                                }
                                                else {
                                                  pcVar4 = "topo";
                                                  uVar3 = 0x2c4;
                                                }
                                              }
                                              else {
                                                pcVar4 = "movie frame";
                                                uVar3 = 0x2be;
                                              }
                                            }
                                            else {
                                              pcVar4 = "swap pass";
                                              uVar3 = 0x2bd;
                                            }
                                          }
                                          else {
                                            pcVar4 = "topo";
                                            uVar3 = 0x2ba;
                                          }
                                        }
                                        else {
                                          pcVar4 = "movie frame";
                                          uVar3 = 0x2b4;
                                        }
                                      }
                                      else {
                                        pcVar4 = "smooth pass";
                                        uVar3 = 0x2b3;
                                      }
                                    }
                                    else {
                                      pcVar4 = "topo";
                                      uVar3 = 0x2b1;
                                    }
                                  }
                                  else {
                                    pcVar4 = "movie frame";
                                    uVar3 = 0x2ab;
                                  }
                                }
                                else {
                                  pcVar4 = "swap pass";
                                  uVar3 = 0x2aa;
                                }
                              }
                              else {
                                pcVar4 = "movie frame";
                                uVar3 = 0x29e;
                              }
                            }
                            else {
                              pcVar4 = "col pass";
                              uVar3 = 0x29d;
                            }
                          }
                          else {
                            pcVar4 = "movie frame";
                            uVar3 = 0x293;
                          }
                        }
                        else {
                          pcVar4 = "swap pass";
                          uVar3 = 0x292;
                        }
                      }
                      else {
                        pcVar4 = "topo";
                        uVar3 = 0x290;
                      }
                    }
                    else {
                      pcVar4 = "movie frame";
                      uVar3 = 0x28a;
                    }
                  }
                  else {
                    pcVar4 = "col pass";
                    uVar3 = 0x289;
                  }
                }
                else {
                  pcVar4 = "topo";
                  uVar3 = 0x287;
                }
              }
              else {
                pcVar4 = "movie frame";
                uVar3 = 0x281;
              }
            }
            else {
              pcVar4 = "swap pass";
              uVar3 = 0x280;
            }
          }
          else {
            pcVar4 = "topo";
            uVar3 = 0x27e;
          }
        }
        else {
          pcVar4 = "movie frame";
          uVar3 = 0x278;
        }
      }
      else {
        pcVar4 = "adapt preflight check";
        uVar3 = 0x276;
      }
    }
    else {
      pcVar4 = "count ngeom";
      uVar3 = 0x275;
    }
  }
  else {
    pcVar4 = "param";
    uVar3 = 0x271;
  }
LAB_00168806:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",uVar3,
         "ref_adapt_pass",(ulong)uVar1,pcVar4);
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_adapt_pass(REF_GRID ref_grid, REF_BOOL *all_done) {
  REF_INT ngeom;
  REF_BOOL all_done0, all_done1;
  REF_INT i, swap_smooth_passes = 1;

  RSS(ref_adapt_parameter(ref_grid, &all_done0), "param");

  RSS(ref_gather_ngeom(ref_grid_node(ref_grid), ref_grid_geom(ref_grid),
                       REF_GEOM_FACE, &ngeom),
      "count ngeom");
  if (ngeom > 0) RSS(ref_geom_verify_topo(ref_grid), "adapt preflight check");

  ref_gather_blocking_frame(ref_grid, "threed pass");
  if (ref_grid_adapt(ref_grid, timing_level) > 1)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt start");
  if (ref_grid_adapt(ref_grid, watch_param))
    RSS(ref_adapt_tattle(ref_grid, "start"), "tattle");
  if (ref_grid_adapt(ref_grid, watch_topo))
    RSS(ref_adapt_topo(ref_grid), "topo");

  RSS(ref_adapt_swap(ref_grid), "swap pass");
  ref_gather_blocking_frame(ref_grid, "swap");
  if (ref_grid_adapt(ref_grid, timing_level) > 1)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt swap");
  if (ref_grid_adapt(ref_grid, watch_param))
    RSS(ref_adapt_tattle(ref_grid, "swap"), "tattle");
  if (ref_grid_adapt(ref_grid, watch_topo))
    RSS(ref_adapt_topo(ref_grid), "topo");

  RSS(ref_collapse_pass(ref_grid), "col pass");
  ref_gather_blocking_frame(ref_grid, "collapse");
  if (ref_grid_adapt(ref_grid, timing_level) > 1)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt col");
  if (ref_grid_adapt(ref_grid, watch_param))
    RSS(ref_adapt_tattle(ref_grid, "col"), "tattle");
  if (ref_grid_adapt(ref_grid, watch_topo))
    RSS(ref_adapt_topo(ref_grid), "topo");

  RSS(ref_adapt_swap(ref_grid), "swap pass");
  ref_gather_blocking_frame(ref_grid, "swap");
  if (ref_grid_adapt(ref_grid, timing_level) > 1)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt swap");
  if (ref_grid_adapt(ref_grid, watch_param))
    RSS(ref_adapt_tattle(ref_grid, "swap"), "tattle");
  if (ref_grid_adapt(ref_grid, watch_topo))
    RSS(ref_adapt_topo(ref_grid), "topo");

  ref_grid_adapt(ref_grid, post_max_ratio) = sqrt(2.0);

  RSS(ref_collapse_pass(ref_grid), "col pass");
  ref_gather_blocking_frame(ref_grid, "collapse");
  if (ref_grid_adapt(ref_grid, timing_level) > 1)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt col");
  if (ref_grid_adapt(ref_grid, watch_param))
    RSS(ref_adapt_tattle(ref_grid, "col"), "tattle");
  if (ref_grid_adapt(ref_grid, watch_topo))
    RSS(ref_adapt_topo(ref_grid), "topo");

  ref_grid_adapt(ref_grid, post_max_ratio) =
      ref_grid_adapt(ref_grid, last_max_ratio);

  for (i = 0; i < swap_smooth_passes; i++) {
    RSS(ref_adapt_swap(ref_grid), "swap pass");
    ref_gather_blocking_frame(ref_grid, "swap");
    if (ref_grid_adapt(ref_grid, timing_level) > 1)
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt swap");
    if (ref_grid_adapt(ref_grid, watch_param))
      RSS(ref_adapt_tattle(ref_grid, "swap"), "tattle");
    if (ref_grid_adapt(ref_grid, watch_topo))
      RSS(ref_adapt_topo(ref_grid), "topo");

    RSS(ref_smooth_pass(ref_grid), "smooth pass");
    ref_gather_blocking_frame(ref_grid, "smooth");
    if (ref_grid_adapt(ref_grid, timing_level > 1))
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt move");
    if (ref_grid_adapt(ref_grid, watch_param))
      RSS(ref_adapt_tattle(ref_grid, "move"), "tattle");
    if (ref_grid_adapt(ref_grid, watch_topo))
      RSS(ref_adapt_topo(ref_grid), "topo");
  }

  RSS(ref_adapt_swap(ref_grid), "swap pass");
  ref_gather_blocking_frame(ref_grid, "swap");
  if (ref_grid_adapt(ref_grid, timing_level) > 1)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt swap");
  if (ref_grid_adapt(ref_grid, watch_param))
    RSS(ref_adapt_tattle(ref_grid, "swap"), "tattle");
  if (ref_grid_adapt(ref_grid, watch_topo))
    RSS(ref_adapt_topo(ref_grid), "topo");

  RSS(ref_adapt_parameter(ref_grid, &all_done1), "param");

  RSS(ref_split_pass(ref_grid), "split surfpass");
  ref_gather_blocking_frame(ref_grid, "split");
  if (ref_grid_adapt(ref_grid, timing_level) > 1)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt spl");
  if (ref_grid_adapt(ref_grid, watch_param))
    RSS(ref_adapt_tattle(ref_grid, "split"), "tattle");
  if (ref_grid_adapt(ref_grid, watch_topo))
    RSS(ref_adapt_topo(ref_grid), "topo");

  RSS(ref_adapt_swap(ref_grid), "swap pass");
  ref_gather_blocking_frame(ref_grid, "swap");
  if (ref_grid_adapt(ref_grid, timing_level) > 1)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt swap");
  if (ref_grid_adapt(ref_grid, watch_param))
    RSS(ref_adapt_tattle(ref_grid, "swap"), "tattle");
  if (ref_grid_adapt(ref_grid, watch_topo))
    RSS(ref_adapt_topo(ref_grid), "topo");

  for (i = 0; i < swap_smooth_passes; i++) {
    RSS(ref_smooth_pass(ref_grid), "smooth pass");
    ref_gather_blocking_frame(ref_grid, "smooth");
    if (ref_grid_adapt(ref_grid, timing_level) > 1)
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt move");
    if (ref_grid_adapt(ref_grid, watch_param))
      RSS(ref_adapt_tattle(ref_grid, "move"), "tattle");
    if (ref_grid_adapt(ref_grid, watch_topo))
      RSS(ref_adapt_topo(ref_grid), "topo");

    RSS(ref_adapt_swap(ref_grid), "swap pass");
    ref_gather_blocking_frame(ref_grid, "swap");
    if (ref_grid_adapt(ref_grid, timing_level) > 1)
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt swap");
    if (ref_grid_adapt(ref_grid, watch_param))
      RSS(ref_adapt_tattle(ref_grid, "swap"), "tattle");
    if (ref_grid_adapt(ref_grid, watch_topo))
      RSS(ref_adapt_topo(ref_grid), "topo");
  }

  ref_grid_adapt(ref_grid, post_max_ratio) = sqrt(2.0);

  RSS(ref_collapse_pass(ref_grid), "col pass");
  ref_gather_blocking_frame(ref_grid, "collapse");
  if (ref_grid_adapt(ref_grid, timing_level) > 1)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt col");
  if (ref_grid_adapt(ref_grid, watch_param))
    RSS(ref_adapt_tattle(ref_grid, "col"), "tattle");
  if (ref_grid_adapt(ref_grid, watch_topo))
    RSS(ref_adapt_topo(ref_grid), "topo");

  ref_grid_adapt(ref_grid, post_max_ratio) =
      ref_grid_adapt(ref_grid, last_max_ratio);

  RSS(ref_adapt_swap(ref_grid), "swap pass");
  ref_gather_blocking_frame(ref_grid, "swap");
  if (ref_grid_adapt(ref_grid, timing_level) > 1)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt swap");
  if (ref_grid_adapt(ref_grid, watch_param))
    RSS(ref_adapt_tattle(ref_grid, "swap"), "tattle");
  if (ref_grid_adapt(ref_grid, watch_topo))
    RSS(ref_adapt_topo(ref_grid), "topo");

  for (i = 0; i < swap_smooth_passes; i++) {
    RSS(ref_smooth_pass(ref_grid), "smooth pass");
    ref_gather_blocking_frame(ref_grid, "smooth");
    if (ref_grid_adapt(ref_grid, timing_level) > 1)
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt move");
    if (ref_grid_adapt(ref_grid, watch_param))
      RSS(ref_adapt_tattle(ref_grid, "move"), "tattle");
    if (ref_grid_adapt(ref_grid, watch_topo))
      RSS(ref_adapt_topo(ref_grid), "topo");

    RSS(ref_adapt_swap(ref_grid), "swap pass");
    ref_gather_blocking_frame(ref_grid, "swap");
    if (ref_grid_adapt(ref_grid, timing_level) > 1)
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt swap");
    if (ref_grid_adapt(ref_grid, watch_param))
      RSS(ref_adapt_tattle(ref_grid, "swap"), "tattle");
    if (ref_grid_adapt(ref_grid, watch_topo))
      RSS(ref_adapt_topo(ref_grid), "topo");
  }

  if (ref_grid_adapt(ref_grid, unlock_tet)) {
    RSS(ref_split_edge_geometry(ref_grid), "split edge geom");
    if (ref_grid_adapt(ref_grid, timing_level) > 1)
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt unlock");
  }

  RSS(ref_adapt_tattle(ref_grid, "adapt"), "tattle");

  if (ngeom > 0)
    RSS(ref_geom_verify_topo(ref_grid), "geom topo postflight check");

  *all_done = (all_done0 && all_done1);

  return REF_SUCCESS;
}